

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O3

results_type * __thiscall
asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
          (results_type *__return_storage_ptr__,
          basic_resolver<asio::ip::tcp,_asio::any_io_executor> *this,query *q)

{
  error_code __ec;
  error_code ec;
  error_code local_50;
  system_error local_40 [32];
  
  local_50._M_value = 0;
  local_50._M_cat = (error_category *)std::_V2::system_category();
  asio::detail::resolver_service<asio::ip::tcp>::resolve
            (__return_storage_ptr__,(this->impl_).service_,&(this->impl_).implementation_,q,
             &local_50);
  __ec._4_4_ = 0;
  __ec._M_value = local_50._M_value;
  if (local_50._M_value != 0) {
    __ec._M_cat = local_50._M_cat;
    std::system_error::system_error(local_40,__ec,"resolve");
    asio::detail::throw_exception<std::system_error>(local_40);
    std::system_error::~system_error(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

results_type resolve(const query& q)
  {
    asio::error_code ec;
    results_type r = impl_.get_service().resolve(
        impl_.get_implementation(), q, ec);
    asio::detail::throw_error(ec, "resolve");
    return r;
  }